

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertSOSCollection
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ArrayRef<int> *sosno,ArrayRef<double> *ref,bool fAllSOS2)

{
  _Rb_tree_node_base *args;
  double dVar1;
  SOSExtraInfo ei;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  Error *pEVar5;
  char *__lhs;
  _Vector_base<int,_std::allocator<int>_> *this_00;
  double *in_R8;
  long lVar6;
  size_t sVar7;
  long lVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_int>_>,_bool> pVar9;
  double local_1f8;
  double local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  vector<double,_std::allocator<double>_> weights;
  vector<int,_std::allocator<int>_> vars;
  _Vector_base<double,_std::allocator<double>_> local_180;
  _Vector_base<int,_std::allocator<int>_> local_168;
  _Vector_base<double,_std::allocator<double>_> local_150;
  _Vector_base<int,_std::allocator<int>_> local_138;
  SOS_1or2_Constraint<2> local_120;
  map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
  sos_map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sos_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sos_map._M_t._M_impl.super__Rb_tree_header._M_header;
  sos_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sos_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sos_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sVar7 = ref->size_;
  lVar6 = sVar7 * -8;
  lVar8 = sVar7 * 4;
  sos_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sos_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    lVar6 = lVar6 + 8;
    lVar8 = lVar8 + -4;
    if (sVar7 == 0) {
      local_1f0 = 1.0;
      local_1f8 = 1.0;
      if (!fAllSOS2) {
        local_1f8 = -1e+100;
        local_1f0 = 1e+100;
      }
      __lhs = "SOS2_";
      if (fAllSOS2) {
        __lhs = "SOS2_PL_";
      }
      p_Var4 = sos_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if ((_Rb_tree_header *)p_Var4 == &sos_map._M_t._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<int,_std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
          ::~_Rb_tree(&sos_map._M_t);
          return;
        }
        args = p_Var4 + 1;
        p_Var3 = p_Var4[2]._M_right;
        if (((p_Var3 != (_Base_ptr)0x0) && (*(int *)&p_Var4[1]._M_parent != 0)) &&
           ((*(double *)(p_Var4[2]._M_parent + 1) != 0.0 ||
            (NAN(*(double *)(p_Var4[2]._M_parent + 1)))))) break;
        if ((_Base_ptr)0x1 < p_Var3) {
          vars.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          vars.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          vars.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          std::vector<int,_std::allocator<int>_>::reserve
                    ((vector<int,_std::allocator<int>_> *)
                     &vars.super__Vector_base<int,_std::allocator<int>_>,(size_type)p_Var3);
          weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<double,_std::allocator<double>_>::reserve
                    ((vector<double,_std::allocator<double>_> *)
                     &weights.super__Vector_base<double,_std::allocator<double>_>,
                     (size_type)p_Var4[2]._M_right);
          for (p_Var3 = p_Var4[2]._M_parent; p_Var3 != (_Base_ptr)&p_Var4[1]._M_right;
              p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)
                       &weights.super__Vector_base<double,_std::allocator<double>_>,
                       (value_type_conflict3 *)(p_Var3 + 1));
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       &vars.super__Vector_base<int,_std::allocator<int>_>,
                       (value_type *)&p_Var3[1]._M_parent);
          }
          if ((int)args->_M_color < 0 || fAllSOS2) {
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_138,
                       (vector<int,_std::allocator<int>_> *)
                       &vars.super__Vector_base<int,_std::allocator<int>_>);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)&local_150,
                       (vector<double,_std::allocator<double>_> *)
                       &weights.super__Vector_base<double,_std::allocator<double>_>);
            std::__cxx11::to_string(&local_70,args->_M_color);
            std::operator+(&local_1d8,__lhs,&local_70);
            std::operator+(&local_50,&local_1d8,'_');
            ei.bounds_.ub_ = local_1f0;
            ei.bounds_.lb_ = local_1f8;
            SOS_1or2_Constraint<2>::
            SOS_1or2_Constraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>
                      (&local_120,(vector<int,_std::allocator<int>_> *)&local_138,
                       (vector<double,_std::allocator<double>_> *)&local_150,ei,&local_50);
            ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
            ::AddConstraint<mp::SOS_1or2_Constraint<2>>
                      ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                        *)this,&local_120);
            SOS_1or2_Constraint<2>::~SOS_1or2_Constraint(&local_120);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_70);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_150);
            this_00 = &local_138;
          }
          else {
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_168,
                       (vector<int,_std::allocator<int>_> *)
                       &vars.super__Vector_base<int,_std::allocator<int>_>);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)&local_180,
                       (vector<double,_std::allocator<double>_> *)
                       &weights.super__Vector_base<double,_std::allocator<double>_>);
            std::__cxx11::to_string(&local_70,args->_M_color);
            std::operator+(&local_1d8,"SOS1_",&local_70);
            std::operator+(&local_90,&local_1d8,'_');
            SOS_1or2_Constraint<1>::
            SOS_1or2_Constraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>
                      ((SOS_1or2_Constraint<1> *)&local_120,
                       (vector<int,_std::allocator<int>_> *)&local_168,
                       (vector<double,_std::allocator<double>_> *)&local_180,&local_90);
            ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
            ::AddConstraint<mp::SOS_1or2_Constraint<1>>
                      ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                        *)this,(SOS_1or2_Constraint<1> *)&local_120);
            SOS_1or2_Constraint<1>::~SOS_1or2_Constraint((SOS_1or2_Constraint<1> *)&local_120);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_70);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_180);
            this_00 = &local_168;
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(this_00);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&weights.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&vars.super__Vector_base<int,_std::allocator<int>_>);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      }
      pEVar5 = (Error *)__cxa_allocate_exception(0x18);
      fmt::format<int>((string *)&local_120,(CStringRef)0x3683f4,(int *)args);
      Error::Error(pEVar5,(CStringRef)local_120.super_BasicConstraint.name_._M_dataplus._M_p,-1);
      __cxa_throw(pEVar5,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    if (*(int *)((long)sosno->data_ + lVar8) != 0) {
      pmVar2 = std::
               map<int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>_>_>
               ::operator[](&sos_map,(key_type_conflict *)((long)sosno->data_ + lVar8));
      local_120.super_BasicConstraint.name_._M_dataplus._M_p =
           *(pointer *)((long)ref->data_ + lVar8 * 2);
      local_120.super_BasicConstraint.name_._M_string_length._0_4_ = (int)sVar7 + -1;
      pVar9 = std::
              _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
              ::_M_insert_unique<std::pair<double_const,int>>
                        ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                          *)&pmVar2->second,(pair<const_double,_int> *)&local_120);
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (((!fAllSOS2) || (dVar1 = *(double *)((long)ref->data_ + lVar8 * 2), dVar1 != 0.0)) ||
           (NAN(dVar1))) {
          pEVar5 = (Error *)__cxa_allocate_exception(0x18);
          fmt::format<int,double>
                    ((string *)&local_120,(fmt *)"SOS/SOS2 constraint {} has repeated weight {}",
                     (char *)(lVar8 + (long)sosno->data_),(int *)((long)ref->data_ - lVar6),in_R8);
          Error::Error(pEVar5,(CStringRef)local_120.super_BasicConstraint.name_._M_dataplus._M_p,-1)
          ;
          __cxa_throw(pEVar5,&Error::typeinfo,fmt::SystemError::~SystemError);
        }
        pmVar2->first = pmVar2->first + 1;
      }
    }
    sVar7 = sVar7 - 1;
  } while( true );
}

Assistant:

void ConvertSOSCollection(ArrayRef<int> sosno, ArrayRef<double> ref,
                            bool fAllSOS2) {
    assert(sosno.size() == ref.size());
    std::map< int,       // pair.first: N repeated zeros
        std::pair< int, std::map< double, int > > > sos_map;
    for (auto i=ref.size(); i--; )
      if (sosno[i]) {
        auto& sos_group = sos_map[sosno[i]];
        if (!sos_group.second.insert( {ref[i], i} ).second) {
          if (!fAllSOS2 || ref[i]) // weights 0 for all: redundant PL linearization
            MP_RAISE(
                  fmt::format(
                    "SOS/SOS2 constraint {} has repeated weight {}",
                    sosno[i], ref[i]));
          else
            ++sos_group.first;
        }
      }
    for (const auto& group: sos_map) {
      if (group.second.second.size()
          && group.second.first
          && group.second.second.begin()->first)  // key non-0
        MP_RAISE(
              fmt::format(
                "SOS/SOS2 constraint {} has repeated 0 weights", group.first));
      if (group.second.second.size()>1) {
        std::vector<int> vars;
        vars.reserve(group.second.second.size());
        std::vector<double> weights;
        weights.reserve(group.second.second.size());
        for (const auto& wv: group.second.second) {
          weights.push_back(wv.first);
          vars.push_back(wv.second);
        }
        if (group.first<0 || fAllSOS2)
          AddConstraint(
                SOS2Constraint(vars, weights,
                               fAllSOS2 ?    // for linearized PL
                                             SOSExtraInfo{{1.0, 1.0}} :
                                             SOSExtraInfo{},
                               (fAllSOS2 ? "SOS2_PL_" : "SOS2_")
                               + std::to_string(group.first)
                               + '_'));
        else
          AddConstraint(
                SOS1Constraint(vars, weights,
                               "SOS1_"
                               + std::to_string(group.first)
                               + '_'));
      }
    }
  }